

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location)

{
  int *piVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  EnumOptions *this_00;
  EnumValueDescriptorProto *enum_value;
  LocationRecorder location;
  LocationRecorder local_30;
  
  bVar4 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar5 = true;
  if (!bVar4) {
    iVar6 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar6 == 0) {
      LocationRecorder::LocationRecorder(&local_30,enum_location,3);
      *(byte *)enum_type->_has_bits_ = (byte)enum_type->_has_bits_[0] | 4;
      if (enum_type->options_ == (EnumOptions *)0x0) {
        this_00 = (EnumOptions *)operator_new(0x68);
        EnumOptions::EnumOptions(this_00);
        enum_type->options_ = this_00;
      }
      bVar5 = ParseOption(this,&enum_type->options_->super_Message,&local_30,OPTION_STATEMENT);
    }
    else {
      LocationRecorder::LocationRecorder
                (&local_30,enum_location,2,
                 (enum_type->value_).super_RepeatedPtrFieldBase.current_size_);
      iVar6 = (enum_type->value_).super_RepeatedPtrFieldBase.current_size_;
      iVar2 = (enum_type->value_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar6 < iVar2) {
        ppvVar3 = (enum_type->value_).super_RepeatedPtrFieldBase.elements_;
        (enum_type->value_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
        enum_value = (EnumValueDescriptorProto *)ppvVar3[iVar6];
      }
      else {
        iVar6 = (enum_type->value_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar2 == iVar6) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(enum_type->value_).super_RepeatedPtrFieldBase,iVar6 + 1);
        }
        piVar1 = &(enum_type->value_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        enum_value = internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>::New()
        ;
        ppvVar3 = (enum_type->value_).super_RepeatedPtrFieldBase.elements_;
        iVar6 = (enum_type->value_).super_RepeatedPtrFieldBase.current_size_;
        (enum_type->value_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
        ppvVar3[iVar6] = enum_value;
      }
      bVar5 = ParseEnumConstant(this,enum_value,&local_30);
    }
    LocationRecorder::~LocationRecorder(&local_30);
  }
  return bVar5;
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location,
                       OPTION_STATEMENT);
  } else {
    LocationRecorder location(enum_location,
        EnumDescriptorProto::kValueFieldNumber, enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location);
  }
}